

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# negative_binomial_dist.hpp
# Opt level: O0

basic_ostream<char,_std::char_traits<char>_> *
trng::operator<<(basic_ostream<char,_std::char_traits<char>_> *out,param_type *P)

{
  fmtflags __fmtfl;
  _Ios_Fmtflags _Var1;
  _Setprecision _Var2;
  ostream *poVar3;
  int iVar4;
  long lVar5;
  void *extraout_RDX;
  param_type *in_RSI;
  void *pvVar6;
  ostream *in_RDI;
  char *in_R8;
  int in_R9D;
  double dVar7;
  double extraout_XMM0_Qa;
  fmtflags flags;
  int iVar8;
  
  __fmtfl = Catch::clara::std::ios_base::flags
                      ((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)));
  lVar5 = *(long *)in_RDI;
  poVar3 = in_RDI + *(long *)(lVar5 + -0x18);
  _Var1 = Catch::clara::std::operator|(_S_dec,_S_fixed);
  iVar4 = (int)lVar5;
  _Var1 = Catch::clara::std::operator|(_Var1,_S_left);
  Catch::clara::std::ios_base::flags((ios_base *)poVar3,_Var1);
  iVar8 = (int)poVar3;
  poVar3 = std::operator<<(in_RDI,'(');
  _Var2 = Catch::clara::std::setprecision(0x10);
  poVar3 = std::operator<<(poVar3,_Var2);
  dVar7 = negative_binomial_dist::param_type::p(in_RSI);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar7);
  pvVar6 = (void *)0x20;
  poVar3 = std::operator<<(poVar3,' ');
  negative_binomial_dist::param_type::r(in_RSI,pvVar6,extraout_RDX,iVar4,in_R8,in_R9D,iVar8);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,extraout_XMM0_Qa);
  std::operator<<(poVar3,')');
  Catch::clara::std::ios_base::flags
            ((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)),__fmtfl);
  return (basic_ostream<char,_std::char_traits<char>_> *)in_RDI;
}

Assistant:

std::basic_ostream<char_t, traits_t> &operator<<(
      std::basic_ostream<char_t, traits_t> &out, const negative_binomial_dist::param_type &P) {
    std::ios_base::fmtflags flags(out.flags());
    out.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
    out << '(' << std::setprecision(math::numeric_limits<double>::digits10 + 1) << P.p() << ' '
        << P.r() << ')';
    out.flags(flags);
    return out;
  }